

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall
TldAsKey::TldAsKey(TldAsKey *this,uint8_t *tld,size_t tld_len,uint32_t nb_name_parts)

{
  this->LessRecentKey = (TldAsKey *)0x0;
  this->HashNext = (TldAsKey *)0x0;
  this->MoreRecentKey = (TldAsKey *)0x0;
  this->max_name_parts = nb_name_parts;
  this->count = 1;
  this->hash = 0;
  CanonicCopy(this->tld,0x40,&this->tld_len,tld,tld_len);
  return;
}

Assistant:

TldAsKey::TldAsKey(uint8_t* tld, size_t tld_len, uint32_t nb_name_parts)
    :
    HashNext(NULL),
    MoreRecentKey(NULL),
    LessRecentKey(NULL),
    max_name_parts(nb_name_parts),
    count(1),
    hash(0)
{
    CanonicCopy(this->tld, sizeof(this->tld) - 1, &this->tld_len, tld, tld_len);
}